

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

WhereTerm * whereScanNext(WhereScan *pScan)

{
  short sVar1;
  int iTab;
  Parse *pParse;
  byte bVar2;
  int iVar3;
  uint uVar4;
  CollSeq *pCVar5;
  Expr *pEVar6;
  ExprList_item *pEVar7;
  ulong uVar8;
  WhereClause *pWVar9;
  WhereTerm *pWVar10;
  int iVar11;
  
  iVar11 = pScan->k;
  pWVar9 = pScan->pWC;
  bVar2 = pScan->iEquiv;
  do {
    sVar1 = pScan->aiColumn[(ulong)bVar2 - 1];
    iTab = pScan->aiCur[(ulong)bVar2 - 1];
    do {
      if (iVar11 < pWVar9->nTerm) {
        pWVar10 = pWVar9->a + iVar11;
        do {
          if ((((pWVar10->leftCursor == iTab) && ((pWVar10->u).leftColumn == (int)sVar1)) &&
              ((sVar1 != -2 ||
               (iVar3 = sqlite3ExprCompareSkip(pWVar10->pExpr->pLeft,pScan->pIdxExpr,iTab),
               iVar3 == 0)))) && ((pScan->iEquiv < 2 || ((pWVar10->pExpr->flags & 1) == 0)))) {
            uVar4._0_2_ = pWVar10->eOperator;
            uVar4._2_1_ = pWVar10->nChild;
            uVar4._3_1_ = pWVar10->eMatchOp;
            if ((uVar4 >> 0xb & 1) != 0) {
              bVar2 = pScan->nEquiv;
              if (bVar2 < 0xb) {
                pEVar6 = pWVar10->pExpr->pRight;
                while ((pEVar6->flags >> 0xc & 1) != 0) {
                  if ((pEVar6->flags >> 0x12 & 1) == 0) {
                    pEVar7 = (ExprList_item *)&pEVar6->pLeft;
                  }
                  else {
                    pEVar7 = ((pEVar6->x).pList)->a;
                  }
                  pEVar6 = pEVar7->pExpr;
                }
                if (pEVar6->op == 0x9e) {
                  if ((ulong)bVar2 == 0) {
                    uVar8 = 0;
LAB_0018e8a5:
                    if ((uint)uVar8 != (uint)bVar2) goto LAB_0018e8c6;
                  }
                  else {
                    uVar8 = 0;
                    do {
                      if ((pScan->aiCur[uVar8] == pEVar6->iTable) &&
                         (pScan->aiColumn[uVar8] == pEVar6->iColumn)) goto LAB_0018e8a5;
                      uVar8 = uVar8 + 1;
                    } while (bVar2 != uVar8);
                  }
                  pScan->aiCur[bVar2] = pEVar6->iTable;
                  pScan->aiColumn[bVar2] = pEVar6->iColumn;
                  pScan->nEquiv = bVar2 + 1;
                  uVar4 = (uint)pWVar10->eOperator;
                }
              }
            }
LAB_0018e8c6:
            if ((pScan->opMask & uVar4 & 0xffff) != 0) {
              if ((((uVar4 & 0xffff) >> 8 & 1) == 0) && (pScan->zCollName != (char *)0x0)) {
                pParse = pWVar9->pWInfo->pParse;
                pEVar6 = pWVar10->pExpr;
                iVar3 = sqlite3IndexAffinityOk(pEVar6,pScan->idxaff);
                if (iVar3 != 0) {
                  pCVar5 = sqlite3BinaryCompareCollSeq(pParse,pEVar6->pLeft,pEVar6->pRight);
                  if (pCVar5 == (CollSeq *)0x0) {
                    pCVar5 = pParse->db->pDfltColl;
                  }
                  iVar3 = sqlite3StrICmp(pCVar5->zName,pScan->zCollName);
                  if (iVar3 == 0) {
                    uVar4 = (uint)pWVar10->eOperator;
                    goto LAB_0018e941;
                  }
                }
              }
              else {
LAB_0018e941:
                if (((((uVar4 & 0x82) == 0) || (pEVar6 = pWVar10->pExpr->pRight, pEVar6->op != 0x9e)
                     ) || (pEVar6->iTable != pScan->aiCur[0])) ||
                   (pEVar6->iColumn != pScan->aiColumn[0])) {
                  pScan->pWC = pWVar9;
                  pScan->k = iVar11 + 1;
                  return pWVar10;
                }
              }
            }
          }
          iVar11 = iVar11 + 1;
          pWVar10 = pWVar10 + 1;
        } while (iVar11 < pWVar9->nTerm);
      }
      pWVar9 = pWVar9->pOuter;
      iVar11 = 0;
    } while (pWVar9 != (WhereClause *)0x0);
    if (pScan->nEquiv <= pScan->iEquiv) {
      return (WhereTerm *)0x0;
    }
    pWVar9 = pScan->pOrigWC;
    bVar2 = pScan->iEquiv + 1;
    pScan->iEquiv = bVar2;
    iVar11 = 0;
  } while( true );
}

Assistant:

static WhereTerm *whereScanNext(WhereScan *pScan){
  int iCur;            /* The cursor on the LHS of the term */
  i16 iColumn;         /* The column on the LHS of the term.  -1 for IPK */
  Expr *pX;            /* An expression being tested */
  WhereClause *pWC;    /* Shorthand for pScan->pWC */
  WhereTerm *pTerm;    /* The term being tested */
  int k = pScan->k;    /* Where to start scanning */

  assert( pScan->iEquiv<=pScan->nEquiv );
  pWC = pScan->pWC;
  while(1){
    iColumn = pScan->aiColumn[pScan->iEquiv-1];
    iCur = pScan->aiCur[pScan->iEquiv-1];
    assert( pWC!=0 );
    do{
      for(pTerm=pWC->a+k; k<pWC->nTerm; k++, pTerm++){
        if( pTerm->leftCursor==iCur
         && pTerm->u.leftColumn==iColumn
         && (iColumn!=XN_EXPR
             || sqlite3ExprCompareSkip(pTerm->pExpr->pLeft,
                                       pScan->pIdxExpr,iCur)==0)
         && (pScan->iEquiv<=1 || !ExprHasProperty(pTerm->pExpr, EP_FromJoin))
        ){
          if( (pTerm->eOperator & WO_EQUIV)!=0
           && pScan->nEquiv<ArraySize(pScan->aiCur)
           && (pX = sqlite3ExprSkipCollate(pTerm->pExpr->pRight))->op==TK_COLUMN
          ){
            int j;
            for(j=0; j<pScan->nEquiv; j++){
              if( pScan->aiCur[j]==pX->iTable
               && pScan->aiColumn[j]==pX->iColumn ){
                  break;
              }
            }
            if( j==pScan->nEquiv ){
              pScan->aiCur[j] = pX->iTable;
              pScan->aiColumn[j] = pX->iColumn;
              pScan->nEquiv++;
            }
          }
          if( (pTerm->eOperator & pScan->opMask)!=0 ){
            /* Verify the affinity and collating sequence match */
            if( pScan->zCollName && (pTerm->eOperator & WO_ISNULL)==0 ){
              CollSeq *pColl;
              Parse *pParse = pWC->pWInfo->pParse;
              pX = pTerm->pExpr;
              if( !sqlite3IndexAffinityOk(pX, pScan->idxaff) ){
                continue;
              }
              assert(pX->pLeft);
              pColl = sqlite3BinaryCompareCollSeq(pParse,
                                                  pX->pLeft, pX->pRight);
              if( pColl==0 ) pColl = pParse->db->pDfltColl;
              if( sqlite3StrICmp(pColl->zName, pScan->zCollName) ){
                continue;
              }
            }
            if( (pTerm->eOperator & (WO_EQ|WO_IS))!=0
             && (pX = pTerm->pExpr->pRight)->op==TK_COLUMN
             && pX->iTable==pScan->aiCur[0]
             && pX->iColumn==pScan->aiColumn[0]
            ){
              testcase( pTerm->eOperator & WO_IS );
              continue;
            }
            pScan->pWC = pWC;
            pScan->k = k+1;
            return pTerm;
          }
        }
      }
      pWC = pWC->pOuter;
      k = 0;
    }while( pWC!=0 );
    if( pScan->iEquiv>=pScan->nEquiv ) break;
    pWC = pScan->pOrigWC;
    k = 0;
    pScan->iEquiv++;
  }
  return 0;
}